

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void vkt::shaderexecutor::anon_unknown_0::TessControlExecutor::generateSources
               (ShaderSpec *shaderSpec,SourceCollections *programCollection)

{
  SourceCollections *pSVar1;
  ProgramSources *pPVar2;
  ShaderSpec *shaderSpec_00;
  string local_1e8;
  ShaderSource local_1c8;
  allocator<char> local_199;
  string local_198;
  string local_178;
  ShaderSource local_158;
  allocator<char> local_129;
  string local_128;
  string local_108;
  ShaderSource local_e8;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  ShaderSource local_78;
  allocator<char> local_39;
  string local_38;
  SourceCollections *local_18;
  SourceCollections *programCollection_local;
  ShaderSpec *shaderSpec_local;
  
  local_18 = programCollection;
  programCollection_local = (SourceCollections *)shaderSpec;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vert",&local_39);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_38);
  shaderexecutor::(anonymous_namespace)::generateVertexShaderForTess_abi_cxx11_();
  glu::VertexSource::VertexSource((VertexSource *)&local_78,&local_98);
  glu::ProgramSources::operator<<(pPVar2,&local_78);
  glu::VertexSource::~VertexSource((VertexSource *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pSVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"tess_control",&local_b9);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&pSVar1->glslSources,&local_b8);
  shaderexecutor::(anonymous_namespace)::TessControlExecutor::generateTessControlShader_abi_cxx11_
            (&local_108,(TessControlExecutor *)programCollection_local,shaderSpec_00);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_e8,&local_108);
  glu::ProgramSources::operator<<(pPVar2,&local_e8);
  glu::TessellationControlSource::~TessellationControlSource((TessellationControlSource *)&local_e8)
  ;
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pSVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"tess_eval",&local_129);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&pSVar1->glslSources,&local_128);
  shaderexecutor::(anonymous_namespace)::generateEmptyTessEvalShader_abi_cxx11_();
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_158,&local_178);
  glu::ProgramSources::operator<<(pPVar2,&local_158);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  pSVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"frag",&local_199);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&pSVar1->glslSources,&local_198);
  shaderexecutor::(anonymous_namespace)::generateEmptyFragmentSource_abi_cxx11_();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_1c8,&local_1e8);
  glu::ProgramSources::operator<<(pPVar2,&local_1c8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  return;
}

Assistant:

void TessControlExecutor::generateSources (const ShaderSpec& shaderSpec, SourceCollections& programCollection)
{
	programCollection.glslSources.add("vert") << glu::VertexSource(generateVertexShaderForTess());
	programCollection.glslSources.add("tess_control") << glu::TessellationControlSource(generateTessControlShader(shaderSpec));
	programCollection.glslSources.add("tess_eval") << glu::TessellationEvaluationSource(generateEmptyTessEvalShader());
	programCollection.glslSources.add("frag") << glu::FragmentSource(generateEmptyFragmentSource());
}